

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O2

int rtr_wait_for_sync(rtr_socket *rtr_socket)

{
  long lVar1;
  int iVar2;
  time_t in_RCX;
  size_t pdu_len;
  long in_FS_OFFSET;
  time_t cur_time;
  undefined1 uStack_10028;
  char cStack_10027;
  uint uStack_10020;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lrtr_get_monotonic_time(&cur_time);
  pdu_len = ((ulong)rtr_socket->refresh_interval + rtr_socket->last_update) - cur_time;
  if ((long)pdu_len < 1) {
    pdu_len = 0;
  }
  lrtr_dbg("RTR Socket: waiting %jd sec. till next sync",pdu_len);
  iVar2 = rtr_receive_pdu(rtr_socket,&uStack_10028,pdu_len,in_RCX);
  if (iVar2 < 0) {
    if (iVar2 == -2) {
      iVar2 = 0;
      lrtr_dbg("RTR Socket: Refresh interval expired");
      goto LAB_00109597;
    }
  }
  else if (cStack_10027 == '\0') {
    iVar2 = 0;
    lrtr_dbg("RTR Socket: Serial Notify received (%u)",(ulong)uStack_10020);
    goto LAB_00109597;
  }
  iVar2 = -1;
LAB_00109597:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int rtr_wait_for_sync(struct rtr_socket *rtr_socket)
{
	char pdu[RTR_MAX_PDU_LEN];

	time_t cur_time;

	lrtr_get_monotonic_time(&cur_time);
	time_t wait = (rtr_socket->last_update + rtr_socket->refresh_interval) - cur_time;

	if (wait < 0)
		wait = 0;

	RTR_DBG("waiting %jd sec. till next sync", (intmax_t)wait);
	const int rtval = rtr_receive_pdu(rtr_socket, pdu, sizeof(pdu), wait);

	if (rtval >= 0) {
		enum pdu_type type = rtr_get_pdu_type(pdu);

		if (type == SERIAL_NOTIFY) {
			RTR_DBG("Serial Notify received (%u)", ((struct pdu_serial_notify *)pdu)->sn);
			return RTR_SUCCESS;
		}
	} else if (rtval == TR_WOULDBLOCK) {
		RTR_DBG1("Refresh interval expired");
		return RTR_SUCCESS;
	}
	return RTR_ERROR;
}